

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid,REF_DBL *field,REF_DBL *distance)

{
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  void *__ptr;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_1a0;
  REF_DBL local_198;
  double local_190;
  double local_170;
  double local_158;
  double local_148;
  REF_DBL local_140;
  REF_DBL local_138;
  double local_130;
  REF_DBL local_128;
  REF_DBL local_120;
  double local_118;
  int local_10c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT passes;
  REF_BOOL update;
  REF_INT *set;
  REF_INT nodes [27];
  REF_INT node;
  REF_INT cell;
  REF_INT cell_node;
  REF_DBL len;
  REF_DBL dist;
  REF_DBL slope;
  REF_DBL gradient [3];
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL node_max;
  REF_DBL node_min;
  REF_DBL *distance_local;
  REF_DBL *field_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[3];
  ref_node_00 = ref_grid->node;
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
           "ref_phys_signed_distance","malloc set of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node_00->max << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x589,
             "ref_phys_signed_distance","malloc set of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (local_10c = 0; local_10c < ref_node_00->max; local_10c = local_10c + 1) {
        *(undefined4 *)((long)__ptr + (long)local_10c * 4) = 0;
      }
      for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max; nodes[0x1a] = nodes[0x1a] + 1) {
        RVar2 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&set);
        if (RVar2 == 0) {
          if (field[set._4_4_] <= field[(int)set]) {
            local_118 = field[set._4_4_];
          }
          else {
            local_118 = field[(int)set];
          }
          if (field[nodes[0]] <= local_118) {
            local_128 = field[nodes[0]];
          }
          else {
            if (field[set._4_4_] <= field[(int)set]) {
              local_120 = field[set._4_4_];
            }
            else {
              local_120 = field[(int)set];
            }
            local_128 = local_120;
          }
          if (field[(int)set] < field[set._4_4_] || field[(int)set] == field[set._4_4_]) {
            local_130 = field[set._4_4_];
          }
          else {
            local_130 = field[(int)set];
          }
          if (local_130 < field[nodes[0]] || local_130 == field[nodes[0]]) {
            local_140 = field[nodes[0]];
          }
          else {
            if (field[(int)set] < field[set._4_4_] || field[(int)set] == field[set._4_4_]) {
              local_138 = field[set._4_4_];
            }
            else {
              local_138 = field[(int)set];
            }
            local_140 = local_138;
          }
          if ((local_128 <= 0.0) && (0.0 <= local_140)) {
            uVar3 = ref_node_tri_grad_nodes(ref_node_00,(REF_INT *)&set,field,&slope);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x58f,"ref_phys_signed_distance",(ulong)uVar3,"grad");
              return uVar3;
            }
            for (node = 0; node < ref_cell_00->node_per; node = node + 1) {
              dVar4 = sqrt(gradient[1] * gradient[1] + slope * slope + gradient[0] * gradient[0]);
              if (dVar4 * 1e+20 <= 0.0) {
                local_148 = -(dVar4 * 1e+20);
              }
              else {
                local_148 = dVar4 * 1e+20;
              }
              if (field[nodes[(long)node + -2]] <= 0.0) {
                local_158 = -field[nodes[(long)node + -2]];
              }
              else {
                local_158 = field[nodes[(long)node + -2]];
              }
              if (local_148 <= local_158) {
                distance[nodes[(long)node + -2]] = 0.0;
              }
              else {
                distance[nodes[(long)node + -2]] = field[nodes[(long)node + -2]] / dVar4;
              }
              *(undefined4 *)((long)__ptr + (long)nodes[(long)node + -2] * 4) = 1;
            }
          }
        }
      }
      bVar1 = true;
      while (bVar1) {
        bVar1 = false;
        for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max; nodes[0x1a] = nodes[0x1a] + 1) {
          RVar2 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&set);
          if ((RVar2 == 0) &&
             (*(int *)((long)__ptr + (long)(int)set * 4) +
              *(int *)((long)__ptr + (long)set._4_4_ * 4) +
              *(int *)((long)__ptr + (long)nodes[0] * 4) == 2)) {
            for (node = 0; node < ref_cell_00->node_per; node = node + 1) {
              if (*(int *)((long)__ptr + (long)nodes[(long)node + -2] * 4) == 0) {
                nodes[0x19] = node + 1;
                if (2 < node + 1) {
                  nodes[0x19] = node + -2;
                }
                dVar4 = pow(ref_node_00->real[nodes[(long)nodes[0x19] + -2] * 0xf] -
                            ref_node_00->real[nodes[(long)node + -2] * 0xf],2.0);
                dVar5 = pow(ref_node_00->real[nodes[(long)nodes[0x19] + -2] * 0xf + 1] -
                            ref_node_00->real[nodes[(long)node + -2] * 0xf + 1],2.0);
                dVar6 = pow(ref_node_00->real[nodes[(long)nodes[0x19] + -2] * 0xf + 2] -
                            ref_node_00->real[nodes[(long)node + -2] * 0xf + 2],2.0);
                local_198 = sqrt(dVar4 + dVar5 + dVar6);
                if (distance[nodes[(long)nodes[0x19] + -2]] <= 0.0) {
                  local_170 = -distance[nodes[(long)nodes[0x19] + -2]];
                }
                else {
                  local_170 = distance[nodes[(long)nodes[0x19] + -2]];
                }
                local_198 = local_170 + local_198;
                nodes[0x19] = node + 2;
                if (2 < node + 2) {
                  nodes[0x19] = node + -1;
                }
                dVar4 = pow(ref_node_00->real[nodes[(long)nodes[0x19] + -2] * 0xf] -
                            ref_node_00->real[nodes[(long)node + -2] * 0xf],2.0);
                dVar5 = pow(ref_node_00->real[nodes[(long)nodes[0x19] + -2] * 0xf + 1] -
                            ref_node_00->real[nodes[(long)node + -2] * 0xf + 1],2.0);
                dVar6 = pow(ref_node_00->real[nodes[(long)nodes[0x19] + -2] * 0xf + 2] -
                            ref_node_00->real[nodes[(long)node + -2] * 0xf + 2],2.0);
                dVar4 = sqrt(dVar4 + dVar5 + dVar6);
                if (distance[nodes[(long)nodes[0x19] + -2]] <= 0.0) {
                  local_190 = -distance[nodes[(long)nodes[0x19] + -2]];
                }
                else {
                  local_190 = distance[nodes[(long)nodes[0x19] + -2]];
                }
                if (local_190 + dVar4 <= local_198) {
                  if (distance[nodes[(long)nodes[0x19] + -2]] <= 0.0) {
                    local_1a0 = -distance[nodes[(long)nodes[0x19] + -2]];
                  }
                  else {
                    local_1a0 = distance[nodes[(long)nodes[0x19] + -2]];
                  }
                  local_198 = local_1a0 + dVar4;
                }
                if (distance[nodes[(long)nodes[0x19] + -2]] < 0.0) {
                  distance[nodes[(long)node + -2]] = -local_198;
                }
                else {
                  distance[nodes[(long)node + -2]] = local_198;
                }
                *(undefined4 *)((long)__ptr + (long)nodes[(long)node + -2] * 4) = 1;
                bVar1 = true;
              }
            }
          }
        }
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                            REF_DBL *distance) {
  REF_DBL node_min, node_max;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL gradient[3], slope, dist, len;
  REF_INT cell_node, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *set;
  REF_BOOL update;
  REF_INT passes;
  ref_malloc_init(set, ref_node_max(ref_node), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    node_min = MIN(MIN(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    node_max = MAX(MAX(field[nodes[0]], field[nodes[1]]), field[nodes[2]]);
    if (node_min <= 0.0 && 0.0 <= node_max) {
      RSS(ref_node_tri_grad_nodes(ref_node, nodes, field, gradient), "grad");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        slope = sqrt(gradient[0] * gradient[0] + gradient[1] * gradient[1] +
                     gradient[2] * gradient[2]);
        if (ref_math_divisible(field[nodes[cell_node]], slope)) {
          distance[nodes[cell_node]] = field[nodes[cell_node]] / slope;
        } else {
          distance[nodes[cell_node]] = 0.0;
        }
        set[nodes[cell_node]] = 1;
      }
    }
  }

  update = REF_TRUE;
  passes = 0;
  while (update) {
    update = REF_FALSE;
    passes++;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (2 == set[nodes[0]] + set[nodes[1]] + set[nodes[2]]) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          if (0 == set[nodes[cell_node]]) {
            dist = 0;
            node = cell_node + 1;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));
            dist = ABS(distance[nodes[node]]) + len;
            node = cell_node + 2;
            if (2 < node) node -= 3;
            len = sqrt(pow(ref_node_xyz(ref_node, 0, nodes[node]) -
                               ref_node_xyz(ref_node, 0, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 1, nodes[node]) -
                               ref_node_xyz(ref_node, 1, nodes[cell_node]),
                           2) +
                       pow(ref_node_xyz(ref_node, 2, nodes[node]) -
                               ref_node_xyz(ref_node, 2, nodes[cell_node]),
                           2));

            dist = MIN(dist, ABS(distance[nodes[node]]) + len);
            if (distance[nodes[node]] >= 0.0) {
              distance[nodes[cell_node]] = dist;
            } else {
              distance[nodes[cell_node]] = -dist;
            }
            set[nodes[cell_node]] = 1;
            update = REF_TRUE;
          }
        }
      }
    }
  }

  ref_free(set);
  return REF_SUCCESS;
}